

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenFaceNormalsProcess.cpp
# Opt level: O0

bool __thiscall
Assimp::GenFaceNormalsProcess::GenMeshFaceNormals(GenFaceNormalsProcess *this,aiMesh *pMesh)

{
  uint uVar1;
  undefined1 auVar2 [16];
  Logger *this_00;
  ulong uVar3;
  ulong uVar4;
  aiVector3D *paVar5;
  aiVector3t<float> *paVar6;
  aiVector3t<float> aVar7;
  aiVector3t<float> *local_f0;
  uint local_c4;
  float fStack_c0;
  uint i_1;
  float local_b8;
  aiVector3t<float> local_b0;
  aiVector3t<float> local_a0;
  aiVector3t<float> local_90;
  aiVector3t<float> local_80;
  aiVector3t<float> local_70;
  undefined8 local_64;
  aiVector3D vNor;
  aiVector3D *pV3;
  aiVector3D *pV2;
  aiVector3D *pV1;
  float local_38;
  uint local_34;
  aiFace *paStack_30;
  uint i;
  aiFace *face;
  uint a;
  float qnan;
  aiMesh *pMesh_local;
  GenFaceNormalsProcess *this_local;
  
  _a = pMesh;
  pMesh_local = (aiMesh *)this;
  if (pMesh->mNormals != (aiVector3D *)0x0) {
    if ((this->force_ & 1U) == 0) {
      return false;
    }
    if (pMesh->mNormals != (aiVector3D *)0x0) {
      operator_delete__(pMesh->mNormals);
    }
  }
  if ((_a->mPrimitiveTypes & 0xc) == 0) {
    this_00 = DefaultLogger::get();
    Logger::info(this_00,"Normal vectors are undefined for line and point meshes");
    this_local._7_1_ = false;
  }
  else {
    uVar3 = CONCAT44(0,_a->mNumVertices);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar3;
    uVar4 = SUB168(auVar2 * ZEXT816(0xc),0);
    if (SUB168(auVar2 * ZEXT816(0xc),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    paVar5 = (aiVector3D *)operator_new__(uVar4);
    if (uVar3 != 0) {
      local_f0 = paVar5;
      do {
        aiVector3t<float>::aiVector3t(local_f0);
        local_f0 = local_f0 + 1;
      } while (local_f0 != paVar5 + uVar3);
    }
    _a->mNormals = paVar5;
    face._4_4_ = get_qnan();
    for (face._0_4_ = 0; (uint)face < _a->mNumFaces; face._0_4_ = (uint)face + 1) {
      paStack_30 = _a->mFaces + (uint)face;
      if (paStack_30->mNumIndices < 3) {
        for (local_34 = 0; local_34 < paStack_30->mNumIndices; local_34 = local_34 + 1) {
          aiVector3t<float>::aiVector3t((aiVector3t<float> *)&pV1,face._4_4_);
          paVar5 = _a->mNormals;
          uVar1 = paStack_30->mIndices[local_34];
          *(aiVector3D **)(paVar5 + uVar1) = pV1;
          paVar5[uVar1].z = local_38;
        }
      }
      else {
        paVar5 = _a->mVertices;
        uVar1 = *paStack_30->mIndices;
        vNor._4_8_ = _a->mVertices + paStack_30->mIndices[paStack_30->mNumIndices - 1];
        aVar7 = ::operator-(_a->mVertices + paStack_30->mIndices[1],paVar5 + uVar1);
        local_90.z = aVar7.z;
        local_80.z = local_90.z;
        local_90._0_8_ = aVar7._0_8_;
        local_80.x = local_90.x;
        local_80.y = local_90.y;
        local_90 = aVar7;
        aVar7 = ::operator-((aiVector3t<float> *)vNor._4_8_,paVar5 + uVar1);
        local_b0.z = aVar7.z;
        local_a0.z = local_b0.z;
        local_b0._0_8_ = aVar7._0_8_;
        local_a0.x = local_b0.x;
        local_a0.y = local_b0.y;
        aVar7 = operator^(&local_80,&local_a0);
        _fStack_c0 = aVar7._0_8_;
        local_70.x = fStack_c0;
        local_70.y = (float)i_1;
        local_b8 = aVar7.z;
        local_70.z = local_b8;
        paVar6 = aiVector3t<float>::NormalizeSafe(&local_70);
        local_64._0_4_ = paVar6->x;
        local_64._4_4_ = paVar6->y;
        vNor.x = paVar6->z;
        for (local_c4 = 0; local_c4 < paStack_30->mNumIndices; local_c4 = local_c4 + 1) {
          paVar5 = _a->mNormals + paStack_30->mIndices[local_c4];
          paVar5->x = (float)(undefined4)local_64;
          paVar5->y = (float)local_64._4_4_;
          paVar5->z = vNor.x;
        }
      }
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool GenFaceNormalsProcess::GenMeshFaceNormals (aiMesh* pMesh)
{
    if (NULL != pMesh->mNormals) {
        if (force_) delete[] pMesh->mNormals;
        else return false;
    }

    // If the mesh consists of lines and/or points but not of
    // triangles or higher-order polygons the normal vectors
    // are undefined.
    if (!(pMesh->mPrimitiveTypes & (aiPrimitiveType_TRIANGLE | aiPrimitiveType_POLYGON)))   {
        ASSIMP_LOG_INFO("Normal vectors are undefined for line and point meshes");
        return false;
    }

    // allocate an array to hold the output normals
    pMesh->mNormals = new aiVector3D[pMesh->mNumVertices];
    const float qnan = get_qnan();

    // iterate through all faces and compute per-face normals but store them per-vertex.
    for( unsigned int a = 0; a < pMesh->mNumFaces; a++) {
        const aiFace& face = pMesh->mFaces[a];
        if (face.mNumIndices < 3)   {
            // either a point or a line -> no well-defined normal vector
            for (unsigned int i = 0;i < face.mNumIndices;++i) {
                pMesh->mNormals[face.mIndices[i]] = aiVector3D(qnan);
            }
            continue;
        }

        const aiVector3D* pV1 = &pMesh->mVertices[face.mIndices[0]];
        const aiVector3D* pV2 = &pMesh->mVertices[face.mIndices[1]];
        const aiVector3D* pV3 = &pMesh->mVertices[face.mIndices[face.mNumIndices-1]];
        const aiVector3D vNor = ((*pV2 - *pV1) ^ (*pV3 - *pV1)).NormalizeSafe();

        for (unsigned int i = 0;i < face.mNumIndices;++i) {
            pMesh->mNormals[face.mIndices[i]] = vNor;
        }
    }
    return true;
}